

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

void __thiscall HighsLpRelaxation::loadModel(HighsLpRelaxation *this)

{
  Highs *this_00;
  pointer pLVar1;
  HighsInt i;
  ulong uVar2;
  long lVar3;
  HighsLp lpmodel;
  LpRow local_770;
  HighsLp local_760;
  HighsLp local_3c8;
  
  HighsLp::HighsLp(&local_760,this->mipsolver->model_);
  std::vector<double,_std::allocator<double>_>::operator=
            (&local_760.col_lower_,
             (vector<double,_std::allocator<double>_> *)
             ((long)&((this->mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain +
             0x308));
  std::vector<double,_std::allocator<double>_>::operator=
            (&local_760.col_upper_,
             (vector<double,_std::allocator<double>_> *)
             ((long)&((this->mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain +
             800));
  local_760.offset_ = 0.0;
  pLVar1 = (this->lprows).
           super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->lprows).
      super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>.
      _M_impl.super__Vector_impl_data._M_finish != pLVar1) {
    (this->lprows).
    super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1;
  }
  std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::reserve
            (&this->lprows,(long)local_760.num_row_);
  lVar3 = 0;
  for (uVar2 = 0; uVar2 != (uint)local_760.num_row_; uVar2 = uVar2 + 1) {
    local_770.age = 0;
    local_770._0_8_ = lVar3;
    std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::
    emplace_back<HighsLpRelaxation::LpRow>(&this->lprows,&local_770);
    lVar3 = lVar3 + 0x100000000;
  }
  if (local_760.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_760.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
      .super__Vector_impl_data._M_start) {
    local_760.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_760.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  this_00 = &this->lpsolver;
  Highs::clearSolver(this_00);
  Highs::clearModel(this_00);
  HighsLp::HighsLp(&local_3c8,&local_760);
  Highs::passModel(this_00,&local_3c8);
  HighsLp::~HighsLp(&local_3c8);
  std::vector<double,_std::allocator<double>_>::resize(&this->colLbBuffer,(long)local_760.num_col_);
  std::vector<double,_std::allocator<double>_>::resize(&this->colUbBuffer,(long)local_760.num_col_);
  HighsLp::~HighsLp(&local_760);
  return;
}

Assistant:

void HighsLpRelaxation::loadModel() {
  HighsLp lpmodel = *mipsolver.model_;
  lpmodel.col_lower_ = mipsolver.mipdata_->domain.col_lower_;
  lpmodel.col_upper_ = mipsolver.mipdata_->domain.col_upper_;
  lpmodel.offset_ = 0;
  lprows.clear();
  lprows.reserve(lpmodel.num_row_);
  for (HighsInt i = 0; i != lpmodel.num_row_; ++i)
    lprows.push_back(LpRow::model(i));
  lpmodel.integrality_.clear();
  lpsolver.clearSolver();
  lpsolver.clearModel();
  lpsolver.passModel(std::move(lpmodel));
  colLbBuffer.resize(lpmodel.num_col_);
  colUbBuffer.resize(lpmodel.num_col_);
}